

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::iterate(GeometryShader_gl_in_ArrayLengthTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  reference ppCVar6;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  MessageBuilder local_208;
  int *local_88;
  GLint *result;
  Case *test;
  undefined1 local_70 [4];
  GLint result_value;
  undefined1 local_50 [8];
  iterator it;
  Functions *gl;
  GeometryShader_gl_in_ArrayLengthTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x299);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(lVar5 + 0x5e0))(0x8c89);
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_buffer_object_id);
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::begin((iterator *)local_50,&this->m_tests);
  while( true ) {
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
    ::end((iterator *)local_70,&this->m_tests);
    bVar1 = std::operator!=((_Self *)local_50,(_Self *)local_70);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    test._4_4_ = 0;
    ppCVar6 = std::
              _Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
              ::operator*((_Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
                           *)local_50);
    result = (GLint *)*ppCVar6;
    (**(code **)(lVar5 + 0x1680))(((Case *)result)->po_id);
    (**(code **)(lVar5 + 0x30))(result[2]);
    (**(code **)(lVar5 + 0x538))(*result,0,result[1]);
    (**(code **)(lVar5 + 0x638))();
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error doing a draw call",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x2b0);
    local_88 = (int *)(**(code **)(lVar5 + 0xd00))(0x8c8e,0,4,1);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not map the buffer object into process space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x2b6);
    test._4_4_ = *local_88;
    (**(code **)(lVar5 + 0x1670))(0x8c8e);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error unmapping the buffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x2be);
    if (test._4_4_ != result[0xc]) break;
    std::
    _Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
    ::operator++((_Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
                  *)local_50);
  }
  this_01 = tcu::TestContext::getLog
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_208,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [24])"Expected array length: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,result + 0xc);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])" but found: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&test + 4));
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_208);
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShader_gl_in_ArrayLengthTest::iterate()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Setup transform feedback */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_object_id);

	/* Execute tests */
	for (testContainer::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		glw::GLint result_value = 0;
		Case*	  test			= *it;

		/* Execute */
		gl.useProgram(test->po_id);

		gl.beginTransformFeedback(test->tf_mode);
		{
			gl.drawArrays(test->draw_call_mode, 0, /* first */
						  test->draw_call_n_vertices);
		}
		gl.endTransformFeedback();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error doing a draw call");

		/* Map transform feedback results */
		glw::GLint* result = (glw::GLint*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */,
															sizeof(glw::GLint), GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map the buffer object into process space");

		/* Extract value from transform feedback */
		result_value = *result;

		/* Unmap transform feedback buffer */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping the buffer object");

		/* Verify results */
		if (result_value != test->expected_array_length)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Expected array length: " << test->expected_array_length
							   << " but found: " << result_value << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}